

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# algorithms.cpp
# Opt level: O2

TridiagonalMatrix * construct_matrix(TridiagonalMatrix *__return_storage_ptr__,int nx,int nt)

{
  int iVar1;
  long lVar2;
  long lVar3;
  size_type __n;
  double dVar4;
  double dVar5;
  allocator_type local_79;
  vec cs;
  value_type_conflict local_60;
  vec bs;
  vec as;
  
  iVar1 = compute_linear_system_size(nx + -1);
  __n = (size_type)iVar1;
  bs.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x3ff0000000000000;
  std::vector<double,_std::allocator<double>_>::vector
            (&as,__n,(value_type_conflict *)&bs,(allocator_type *)&cs);
  cs.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  std::vector<double,_std::allocator<double>_>::vector
            (&bs,__n,(value_type_conflict *)&cs,(allocator_type *)&local_60);
  local_60 = 0.0;
  std::vector<double,_std::allocator<double>_>::vector(&cs,__n,&local_60,&local_79);
  dVar5 = (0.7853981633974483 / (double)nx) * (0.7853981633974483 / (double)nx);
  dVar4 = -2.0 / dVar5 + -1.0 / (1.0 / (double)nt);
  dVar5 = 1.0 / dVar5;
  *as.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data._M_start =
       dVar4;
  *cs.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data._M_start =
       dVar5;
  lVar2 = (long)(nx + -2);
  for (lVar3 = 1; lVar3 < lVar2; lVar3 = lVar3 + 1) {
    as.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data._M_start
    [lVar3] = dVar4;
    bs.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data._M_start
    [lVar3] = dVar5;
    cs.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data._M_start
    [lVar3] = dVar5;
  }
  as.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data._M_start
  [lVar2] = dVar4;
  bs.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data._M_start
  [lVar2] = dVar5;
  TridiagonalMatrix::TridiagonalMatrix(__return_storage_ptr__,&as,&bs,&cs);
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
            (&cs.super__Vector_base<double,_std::allocator<double>_>);
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
            (&bs.super__Vector_base<double,_std::allocator<double>_>);
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
            (&as.super__Vector_base<double,_std::allocator<double>_>);
  return __return_storage_ptr__;
}

Assistant:

TridiagonalMatrix construct_matrix(int nx, int nt)
{
    int size = compute_linear_system_size(nx - 1);

    vec as(size, 1.0);
    vec bs(size, 0.0);
    vec cs(size, 0.0);

    double h = X / nx;
    double tau = T / nt;

    double a = - 1.0 / tau - 2.0 / (h * h);
    double b_and_c = 1.0 / (h * h);

    as[0] = a;
    cs[0] = b_and_c;
    for (int i = 1; i < nx - 2; i++)
    {
        as[i] = a;
        bs[i] = b_and_c;
        cs[i] = b_and_c;
    }
    as[nx - 2] = a;
    bs[nx - 2] = b_and_c;

    return TridiagonalMatrix(as, bs, cs);
}